

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

void __thiscall iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF(AttitudeQuaternionEKF *this)

{
  MatrixDynSize *in_RDX;
  VectorDynSize *in_RSI;
  
  ekfComputeJacobianF((AttitudeQuaternionEKF *)
                      (this[-1].m_gravity_direction.super_Vector3.m_data + 2),in_RSI,in_RDX);
  return;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianF(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& F)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "state size mismatch");
        return false;
    }

    if (F.rows() != m_state_size || F.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianF", "jacobian matrix size mismatch");
        return false;
    }

    F.zero();

    iDynTree::UnitQuaternion q;
    iDynTree::Vector3 ang_vel, gyro_bias;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);
    toEigen(ang_vel) = toEigen(x).block<3,1>(4, 0);
    toEigen(gyro_bias) = toEigen(x).block<3,1>(7, 0);

    iDynTree::Matrix4x4 dfq_by_dq;
    dfq_by_dq(0,0) = dfq_by_dq(1, 1) = dfq_by_dq(2, 2) = dfq_by_dq(3, 3) = (2.0/m_params_qekf.time_step_in_seconds);
    dfq_by_dq(1, 0) = dfq_by_dq(2, 3) = ang_vel(0);
    dfq_by_dq(2, 0) = dfq_by_dq(3, 1) = ang_vel(1);
    dfq_by_dq(3, 0) = dfq_by_dq(1, 2) = ang_vel(2);
    dfq_by_dq(0, 1) = dfq_by_dq(3, 2) = -ang_vel(0);
    dfq_by_dq(0, 2) = dfq_by_dq(1, 3) = -ang_vel(1);
    dfq_by_dq(0, 3) = dfq_by_dq(2, 1) = -ang_vel(2);
    toEigen(dfq_by_dq) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::MatrixDynSize dfq_by_dangvel;
    dfq_by_dangvel.resize(4, 3);
    dfq_by_dangvel(0, 0) = dfq_by_dangvel(2, 2) = -q(1);
    dfq_by_dangvel(0, 1) = dfq_by_dangvel(3, 0) = -q(2);
    dfq_by_dangvel(0, 2) = dfq_by_dangvel(1, 1) = -q(3);
    dfq_by_dangvel(2, 0) = q(3);
    dfq_by_dangvel(1, 2) = q(2);
    dfq_by_dangvel(3, 1) = q(1);
    dfq_by_dangvel(1, 0) = dfq_by_dangvel(2, 1) = dfq_by_dangvel(3, 2) = -q(0);
    toEigen(dfq_by_dangvel) *= (m_params_qekf.time_step_in_seconds/2.0);

    iDynTree::Matrix3x3 dfangvel_by_dgyrobias(m_Id3);
    toEigen(dfangvel_by_dgyrobias) *= -1;

    iDynTree::Matrix3x3 dfgyrobias_by_dgyrobias(m_Id3);
    toEigen(dfgyrobias_by_dgyrobias) *= (1 - (m_params_qekf.bias_correlation_time_factor*m_params_qekf.time_step_in_seconds));

    toEigen(F).block<4,4>(0,0) = toEigen(dfq_by_dq);
    toEigen(F).block<4,3>(0,4) = toEigen(dfq_by_dangvel);
    toEigen(F).block<3,3>(4,7) = toEigen(dfangvel_by_dgyrobias);
    toEigen(F).block<3,3>(7,7) = toEigen(dfgyrobias_by_dgyrobias);

    return true;
}